

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

int Cudd_ApaCompare(int digitsFirst,DdApaNumber first,int digitsSecond,DdApaNumber second)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = 0;
  uVar7 = 0;
  if (0 < digitsFirst) {
    uVar7 = (ulong)(uint)digitsFirst;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    if (first[uVar4] != 0) {
      uVar7 = uVar4 & 0xffffffff;
      break;
    }
  }
  uVar4 = 0;
  uVar9 = 0;
  if (0 < digitsSecond) {
    uVar9 = (ulong)(uint)digitsSecond;
  }
  do {
    if (uVar9 == uVar4) {
LAB_00643ec0:
      uVar6 = digitsFirst - (int)uVar7;
      iVar5 = digitsSecond - (int)uVar9;
      iVar3 = 1;
      if ((int)uVar6 <= iVar5) {
        if (iVar5 <= (int)uVar6) {
          uVar8 = 0;
          uVar4 = (ulong)uVar6;
          if ((int)uVar6 < 1) {
            uVar4 = uVar8;
          }
          do {
            if (uVar4 == uVar8) {
              return 0;
            }
            lVar1 = uVar7 + uVar8;
            lVar2 = uVar9 + uVar8;
            if (second[lVar2] < first[lVar1]) {
              return 1;
            }
            uVar8 = uVar8 + 1;
          } while (second[lVar2] <= first[lVar1]);
        }
        iVar3 = -1;
      }
      return iVar3;
    }
    if (second[uVar4] != 0) {
      uVar9 = uVar4 & 0xffffffff;
      goto LAB_00643ec0;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int
Cudd_ApaCompare(
  int digitsFirst,
  DdApaNumber  first,
  int digitsSecond,
  DdApaNumber  second)
{
    int i;
    int firstNZ, secondNZ;

    /* Find first non-zero in both numbers. */
    for (firstNZ = 0; firstNZ < digitsFirst; firstNZ++)
        if (first[firstNZ] != 0) break;
    for (secondNZ = 0; secondNZ < digitsSecond; secondNZ++)
        if (second[secondNZ] != 0) break;
    if (digitsFirst - firstNZ > digitsSecond - secondNZ) return(1);
    else if (digitsFirst - firstNZ < digitsSecond - secondNZ) return(-1);
    for (i = 0; i < digitsFirst - firstNZ; i++) {
        if (first[firstNZ + i] > second[secondNZ + i]) return(1);
        else if (first[firstNZ + i] < second[secondNZ + i]) return(-1);
    }
    return(0);

}